

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_e23c::AudioState::decodeFrame(AudioState *this)

{
  uint8_t **ppuVar1;
  AVFrame *pAVar2;
  AVRational AVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  int unaff_EBX;
  
  ppuVar1 = &this->mSamples;
  do {
    if (((this->mMovie->mQuit)._M_base._M_i & 1U) != 0) {
      return 0;
    }
    while (iVar4 = avcodec_receive_frame
                             ((this->mCodecCtx)._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,
                              (this->mDecodedFrame)._M_t.
                              super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>.
                              _M_t.
                              super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                              .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl), iVar4 == -0xb)
    {
      PacketQueue<2097152UL>::sendTo
                (&this->mPackets,
                 (this->mCodecCtx)._M_t.
                 super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
    }
    if (iVar4 == -0x20464f45) {
      iVar4 = 3;
    }
    else {
      if (iVar4 == 0) {
        pAVar2 = (this->mDecodedFrame)._M_t.
                 super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                 super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                 super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl;
        iVar4 = pAVar2->nb_samples;
        if (0 < iVar4) {
          AVar3 = this->mStream->time_base;
          (this->mCurrentPts).__r =
               (long)((double)pAVar2->best_effort_timestamp *
                      ((double)AVar3.num / (double)AVar3.den) * 1000000000.0);
          if (this->mSamplesMax < iVar4) {
            av_freep(ppuVar1);
            av_samples_alloc(ppuVar1,0,
                             ((this->mCodecCtx)._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->
                             channels,((this->mDecodedFrame)._M_t.
                                       super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                       .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl)->
                                      nb_samples,this->mDstSampleFmt,0);
            this->mSamplesMax =
                 ((this->mDecodedFrame)._M_t.
                  super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                  super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                  super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl)->nb_samples;
          }
          pAVar2 = (this->mDecodedFrame)._M_t.
                   super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                   super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                   super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl;
          iVar4 = pAVar2->nb_samples;
          unaff_EBX = swr_convert((this->mSwresCtx)._M_t.
                                  super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>
                                  .super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl,ppuVar1,
                                  iVar4,pAVar2,iVar4);
          av_frame_unref((this->mDecodedFrame)._M_t.
                         super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                         super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                         super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl);
          iVar4 = 1;
          goto LAB_00109dc6;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to receive frame: ",0x19);
        plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
      }
      iVar4 = 2;
    }
LAB_00109dc6:
    if (iVar4 != 2) {
      iVar5 = 0;
      if (iVar4 != 3) {
        iVar5 = unaff_EBX;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

int AudioState::decodeFrame()
{
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), mDecodedFrame.get())) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        if(mDecodedFrame->nb_samples <= 0)
            continue;

        /* If provided, update w/ pts */
        if(mDecodedFrame->best_effort_timestamp != AVNoPtsValue)
            mCurrentPts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(mDecodedFrame->best_effort_timestamp)});

        if(mDecodedFrame->nb_samples > mSamplesMax)
        {
            av_freep(&mSamples);
            av_samples_alloc(&mSamples, nullptr, mCodecCtx->channels, mDecodedFrame->nb_samples,
                mDstSampleFmt, 0);
            mSamplesMax = mDecodedFrame->nb_samples;
        }
        /* Return the amount of sample frames converted */
        int data_size{swr_convert(mSwresCtx.get(), &mSamples, mDecodedFrame->nb_samples,
            const_cast<const uint8_t**>(mDecodedFrame->data), mDecodedFrame->nb_samples)};

        av_frame_unref(mDecodedFrame.get());
        return data_size;
    }

    return 0;
}